

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsCreatePropertyId(char *name,size_t length,JsPropertyIdRef *propertyId)

{
  JsErrorCode JVar1;
  undefined1 local_40 [8];
  NarrowToWide wname;
  char *name_local;
  
  if (name == (char *)0x0) {
    JVar1 = JsErrorNullArgument;
  }
  else {
    wname._24_8_ = name;
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                         *)local_40,(char **)&wname.freeDst,length);
    if (local_40 == (undefined1  [8])0x0) {
      JVar1 = JsErrorOutOfMemory;
    }
    else {
      JVar1 = JsGetPropertyIdFromNameInternal((WCHAR *)local_40,(ulong)(uint)wname.dst,propertyId);
    }
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    ~NarrowWideConverter
              ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                *)local_40);
  }
  return JVar1;
}

Assistant:

CHAKRA_API JsCreatePropertyId(
    _In_z_ const char *name,
    _In_ size_t length,
    _Out_ JsPropertyIdRef *propertyId)
{
    PARAM_NOT_NULL(name);
    utf8::NarrowToWide wname(name, length);
    if (!wname)
    {
        return JsErrorOutOfMemory;
    }

    return JsGetPropertyIdFromNameInternal(wname, wname.Length(), propertyId);
}